

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O3

LY_ERR lys_set_features(lysp_module *pmod,char **features)

{
  char *__s1;
  bool bVar1;
  ulong uVar2;
  ushort uVar3;
  uint in_EAX;
  int iVar4;
  size_t sVar5;
  lysp_feature *plVar6;
  char *pcVar7;
  ulong uVar8;
  uint32_t i;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (features != (char **)0x0) {
    pcVar7 = *features;
    if (pcVar7 == (char *)0x0) {
      plVar6 = lysp_feature_next((lysp_feature *)0x0,pmod,(uint32_t *)((long)&uStack_38 + 4));
      if (plVar6 == (lysp_feature *)0x0) {
        return LY_EEXIST;
      }
      bVar1 = false;
      do {
        if ((plVar6->flags & 0x20) != 0) {
          plVar6->flags = plVar6->flags & 0xffdf;
          bVar1 = true;
        }
        plVar6 = lysp_feature_next(plVar6,pmod,(uint32_t *)((long)&uStack_38 + 4));
      } while (plVar6 != (lysp_feature *)0x0);
    }
    else {
      if ((*pcVar7 != '*') || (pcVar7[1] != '\0')) {
        sVar5 = strlen(pcVar7);
        uVar8 = 0;
        plVar6 = lysp_feature_find(pmod,pcVar7,sVar5,'\0');
        if (plVar6 == (lysp_feature *)0x0) {
LAB_00153f50:
          ly_log(pmod->mod->ctx,LY_LLERR,LY_EINVAL,"Feature \"%s\" not found in module \"%s\".",
                 features[uVar8],pmod->mod->name);
          return LY_EINVAL;
        }
        uVar2 = 1;
LAB_00153f1e:
        uVar8 = uVar2;
        pcVar7 = features[uVar8];
        if (pcVar7 != (char *)0x0) goto code_r0x00153f2e;
        plVar6 = lysp_feature_next((lysp_feature *)0x0,pmod,(uint32_t *)((long)&uStack_38 + 4));
        if (plVar6 == (lysp_feature *)0x0) {
          return LY_EEXIST;
        }
        bVar1 = false;
        do {
          pcVar7 = *features;
          if (pcVar7 != (char *)0x0) {
            __s1 = plVar6->name;
            uVar8 = 1;
            do {
              iVar4 = strcmp(__s1,pcVar7);
              if (iVar4 == 0) {
                if ((plVar6->flags & 0x20) != 0) goto LAB_00154037;
                uVar3 = plVar6->flags | 0x20;
                goto LAB_0015402f;
              }
              pcVar7 = features[uVar8];
              uVar8 = (ulong)((int)uVar8 + 1);
            } while (pcVar7 != (char *)0x0);
          }
          if ((plVar6->flags & 0x20) != 0) {
            uVar3 = plVar6->flags & 0xffdf;
LAB_0015402f:
            plVar6->flags = uVar3;
            bVar1 = true;
          }
LAB_00154037:
          plVar6 = lysp_feature_next(plVar6,pmod,(uint32_t *)((long)&uStack_38 + 4));
        } while (plVar6 != (lysp_feature *)0x0);
        goto LAB_00154092;
      }
      plVar6 = lysp_feature_next((lysp_feature *)0x0,pmod,(uint32_t *)((long)&uStack_38 + 4));
      if (plVar6 == (lysp_feature *)0x0) {
        return LY_EEXIST;
      }
      bVar1 = false;
      do {
        if ((plVar6->flags & 0x20) == 0) {
          plVar6->flags = plVar6->flags | 0x20;
          bVar1 = true;
        }
        plVar6 = lysp_feature_next(plVar6,pmod,(uint32_t *)((long)&uStack_38 + 4));
      } while (plVar6 != (lysp_feature *)0x0);
    }
LAB_00154092:
    if (bVar1) {
      return LY_SUCCESS;
    }
  }
  return LY_EEXIST;
code_r0x00153f2e:
  sVar5 = strlen(pcVar7);
  plVar6 = lysp_feature_find(pmod,pcVar7,sVar5,'\0');
  uVar2 = (ulong)((int)uVar8 + 1);
  if (plVar6 == (lysp_feature *)0x0) goto LAB_00153f50;
  goto LAB_00153f1e;
}

Assistant:

LY_ERR
lys_set_features(struct lysp_module *pmod, const char **features)
{
    uint32_t i = 0, j;
    struct lysp_feature *f = 0;
    ly_bool change = 0;

    if (!features) {
        /* do not touch the features */

    } else if (!features[0]) {
        /* disable all the features */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            if (f->flags & LYS_FENABLED) {
                f->flags &= ~LYS_FENABLED;
                change = 1;
            }
        }
    } else if (!strcmp(features[0], "*")) {
        /* enable all the features */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            if (!(f->flags & LYS_FENABLED)) {
                f->flags |= LYS_FENABLED;
                change = 1;
            }
        }
    } else {
        /* check that all the features exist */
        for (j = 0; features[j]; ++j) {
            if (!lysp_feature_find(pmod, features[j], strlen(features[j]), 0)) {
                LOGERR(pmod->mod->ctx, LY_EINVAL, "Feature \"%s\" not found in module \"%s\".", features[j], pmod->mod->name);
                return LY_EINVAL;
            }
        }

        /* enable specific features, disable the rest */
        while ((f = lysp_feature_next(f, pmod, &i))) {
            for (j = 0; features[j]; ++j) {
                if (!strcmp(f->name, features[j])) {
                    break;
                }
            }

            if (features[j] && !(f->flags & LYS_FENABLED)) {
                /* enable */
                f->flags |= LYS_FENABLED;
                change = 1;
            } else if (!features[j] && (f->flags & LYS_FENABLED)) {
                /* disable */
                f->flags &= ~LYS_FENABLED;
                change = 1;
            }
        }
    }

    if (!change) {
        /* features already set correctly */
        return LY_EEXIST;
    }

    return LY_SUCCESS;
}